

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Ssl.cpp
# Opt level: O2

int __thiscall axl::io::Ssl::shutdown(Ssl *this,int __fd,int __how)

{
  int retCode;
  int extraout_EAX;
  int iVar1;
  
  retCode = SSL_shutdown((SSL *)(this->
                                super_Handle<ssl_st_*,_axl::io::FreeSsl,_axl::sl::Zero<ssl_st_*>_>).
                                m_h);
  iVar1 = retCode;
  if (retCode < 0) {
    setError(this,retCode);
    iVar1 = extraout_EAX;
  }
  return CONCAT31((int3)((uint)iVar1 >> 8),-1 < retCode);
}

Assistant:

bool
Ssl::shutdown() {
	ASSERT(m_h);

	int result = ::SSL_shutdown(m_h);
	if (result < 0) { // 0 here means shutdown in progress
		setError(result);
		return false;
	}

	return true;
}